

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf.cc
# Opt level: O2

void bloaty::ReadDWARFInlines(File *file,RangeSink *sink,bool include_line)

{
  uint16_t uVar1;
  pointer pAVar2;
  uint64_t uVar3;
  uint32_t __val;
  bool bVar4;
  Abbrev *pAVar5;
  string *__lhs;
  uint uVar6;
  string *in_R8;
  pointer pAVar7;
  uint64_t vmaddr;
  uint64_t uVar8;
  optional<unsigned_long> oVar9;
  string last_source;
  DIEReader local_2b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_298;
  anon_union_16_2_fba5e7b8_for_AttrValue_0 local_278;
  size_type local_268;
  LineInfoReader line_info_reader;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  CUIter iter;
  InfoReader reader;
  CU cu;
  
  if (((file->debug_info)._M_len == 0) || ((file->debug_line)._M_len == 0)) {
    Throw("no debug info",0x2d1);
  }
  reader.stmt_list_map_._M_h._M_buckets = &reader.stmt_list_map_._M_h._M_single_bucket;
  reader.skeleton_ = (CU *)0x0;
  reader.stmt_list_map_._M_h._M_bucket_count = 1;
  reader.stmt_list_map_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reader.stmt_list_map_._M_h._M_element_count = 0;
  reader.stmt_list_map_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reader.stmt_list_map_._M_h._M_rehash_policy._M_next_resize = 0;
  reader.stmt_list_map_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  reader.abbrev_tables_._M_h._M_buckets = &reader.abbrev_tables_._M_h._M_single_bucket;
  reader.abbrev_tables_._M_h._M_bucket_count = 1;
  reader.abbrev_tables_._M_h._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  reader.abbrev_tables_._M_h._M_element_count = 0;
  reader.abbrev_tables_._M_h._M_rehash_policy._M_max_load_factor = 1.0;
  reader.abbrev_tables_._M_h._M_rehash_policy._M_next_resize = 0;
  reader.abbrev_tables_._M_h._M_single_bucket = (__node_base_ptr)0x0;
  reader.dwarf_ = file;
  dwarf::InfoReader::GetCUIter(&iter,&reader,kDebugInfo,0);
  cu.unit_name_._M_dataplus._M_p = (pointer)&cu.unit_name_.field_2;
  cu.data_._M_len = 0;
  cu.data_._M_str = (char *)0x0;
  cu.entire_unit_._M_len = 0;
  cu.entire_unit_._M_str = (char *)0x0;
  cu.unit_name_._M_string_length = 0;
  cu.unit_name_.field_2._M_local_buf[0] = '\0';
  cu.addr_base_ = 0;
  cu.str_offsets_base_ = 0;
  cu.range_lists_base_ = 0;
  cu.strp_callback_.super__Function_base._M_functor._M_unused._M_object = (void *)0x0;
  cu.strp_callback_._M_invoker = (_Invoker_type)0x0;
  cu.strp_callback_.super__Function_base._M_functor._8_8_ = 0;
  cu.strp_callback_.super__Function_base._M_manager = (_Manager_type)0x0;
  local_2b8.depth_ = 0;
  line_info_reader.info_.address = 0;
  line_info_reader.include_directories_.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  line_info_reader.include_directories_.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line_info_reader.include_directories_.
  super__Vector_base<std::basic_string_view<char,_std::char_traits<char>_>,_std::allocator<std::basic_string_view<char,_std::char_traits<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line_info_reader.filenames_.
  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  line_info_reader.filenames_.
  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line_info_reader.filenames_.
  super__Vector_base<bloaty::dwarf::LineInfoReader::FileName,_std::allocator<bloaty::dwarf::LineInfoReader::FileName>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line_info_reader.standard_opcode_lengths_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  line_info_reader.standard_opcode_lengths_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  line_info_reader.standard_opcode_lengths_.
  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  line_info_reader.expanded_filenames_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  line_info_reader.expanded_filenames_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  line_info_reader.expanded_filenames_.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  line_info_reader.remaining_._M_len = 0;
  line_info_reader.remaining_._M_str = (char *)0x0;
  line_info_reader.info_.file = 1;
  line_info_reader.info_.line = 1;
  line_info_reader.info_._16_7_ = 0;
  local_2b8.remaining_._M_len = 0;
  local_2b8.remaining_._M_str = (char *)0x0;
  line_info_reader.info_.discriminator._3_1_ = 0;
  line_info_reader.info_.end_sequence = false;
  line_info_reader.info_.basic_block = false;
  line_info_reader.info_.prologue_end = false;
  line_info_reader.info_.epilogue_begin = false;
  line_info_reader.info_.is_stmt = false;
  line_info_reader.info_.op_index = '\0';
  line_info_reader.info_.isa = '\0';
  line_info_reader.file_ = file;
  bVar4 = dwarf::CUIter::NextCU(&iter,&reader,&cu);
  if (!bVar4) {
    Throw("debug info is present, but empty",0x2db);
  }
  do {
    do {
      pAVar5 = dwarf::DIEReader::ReadCode(&local_2b8,&cu);
      if (pAVar5 == (Abbrev *)0x0) {
        dwarf::LineInfoReader::~LineInfoReader(&line_info_reader);
        dwarf::CU::~CU(&cu);
        dwarf::InfoReader::~InfoReader(&reader);
        return;
      }
      pAVar2 = (pAVar5->attr).
               super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
               ._M_impl.super__Vector_impl_data._M_finish;
      uVar6 = 0;
      for (pAVar7 = (pAVar5->attr).
                    super__Vector_base<bloaty::dwarf::AbbrevTable::Attribute,_std::allocator<bloaty::dwarf::AbbrevTable::Attribute>_>
                    ._M_impl.super__Vector_impl_data._M_start; pAVar7 != pAVar2; pAVar7 = pAVar7 + 1
          ) {
        uVar1 = pAVar7->name;
        dwarf::AttrValue::ParseAttr
                  ((AttrValue *)&local_278.string_,(AttrValue *)&cu,(CU *)(ulong)pAVar7->form,
                   (uint16_t)&local_2b8,(string_view *)in_R8);
        local_1a8.field_2._M_allocated_capacity = local_268;
        local_1a8._M_dataplus._M_p = (pointer)local_278.uint_;
        local_1a8._M_string_length = (size_type)local_278.string_._M_str;
        if (uVar1 == 0x10) {
          oVar9 = dwarf::AttrValue::ToUint((AttrValue *)&local_1a8,&cu);
          file = oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                 super__Optional_payload_base<unsigned_long>._M_payload;
          uVar6 = oVar9.super__Optional_base<unsigned_long,_true,_true>._M_payload.
                  super__Optional_payload_base<unsigned_long>._8_4_;
        }
      }
    } while ((uVar6 & 1) == 0);
    dwarf::LineInfoReader::SeekToOffset
              (&line_info_reader,(uint64_t)file,cu.unit_sizes_.addr8_ * '\x04' + '\x04');
    last_source._M_dataplus._M_p = (pointer)&last_source.field_2;
    last_source._M_string_length = 0;
    last_source.field_2._M_local_buf[0] = '\0';
    vmaddr = 0;
    while (bVar4 = dwarf::LineInfoReader::ReadLineInfo(&line_info_reader),
          uVar3 = line_info_reader.info_.address, bVar4) {
      __lhs = &last_source;
      if (line_info_reader.info_.end_sequence == false) {
        __val = line_info_reader.info_.line;
        __lhs = dwarf::LineInfoReader::GetExpandedFilename_abi_cxx11_
                          (&line_info_reader,line_info_reader.info_._8_8_ & 0xffffffff);
        if (!include_line) goto LAB_00194119;
        std::operator+(&local_1a8,__lhs,":");
        std::__cxx11::to_string((string *)&local_278.string_,__val);
        std::operator+(&local_298,&local_1a8,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_278.string_);
        std::__cxx11::string::~string((string *)&local_278.string_);
        std::__cxx11::string::~string((string *)&local_1a8);
      }
      else {
LAB_00194119:
        std::__cxx11::string::string((string *)&local_298,(string *)__lhs);
      }
      uVar8 = uVar3;
      if ((vmaddr != 0) &&
         ((line_info_reader.info_.end_sequence != false ||
          ((uVar8 = vmaddr, last_source._M_string_length != 0 &&
           (bVar4 = std::operator!=(&local_298,&last_source), bVar4)))))) {
        in_R8 = &last_source;
        RangeSink::AddVMRange(sink,"dwarf_stmtlist",vmaddr,uVar3 - vmaddr,in_R8);
        uVar8 = uVar3;
        if (line_info_reader.info_.end_sequence != false) {
          uVar8 = 0;
        }
      }
      std::__cxx11::string::_M_assign((string *)&last_source);
      std::__cxx11::string::~string((string *)&local_298);
      vmaddr = uVar8;
    }
    std::__cxx11::string::~string((string *)&last_source);
  } while( true );
}

Assistant:

void ReadDWARFInlines(const dwarf::File& file, RangeSink* sink,
                      bool include_line) {
  if (!file.debug_info.size() || !file.debug_line.size()) {
    THROW("no debug info");
  }

  dwarf::InfoReader reader(file);
  dwarf::CUIter iter = reader.GetCUIter(dwarf::InfoReader::Section::kDebugInfo);
  dwarf::CU cu;
  dwarf::DIEReader die_reader = cu.GetDIEReader();
  dwarf::LineInfoReader line_info_reader(file);

  if (!iter.NextCU(reader, &cu)) {
    THROW("debug info is present, but empty");
  }

  while (auto abbrev = die_reader.ReadCode(cu)) {
    absl::optional<uint64_t> stmt_list;
    die_reader.ReadAttributes(
        cu, abbrev, [&stmt_list, &cu](uint16_t tag, dwarf::AttrValue val) {
          if (tag == DW_AT_stmt_list) {
            stmt_list = val.ToUint(cu);
          }
        });

    if (stmt_list) {
      line_info_reader.SeekToOffset(*stmt_list, cu.unit_sizes().address_size());
      ReadDWARFStmtList(include_line, &line_info_reader, sink);
    }
  }
}